

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,char *p)

{
  size_t *psVar1;
  type tVar2;
  char *pcVar3;
  type tVar4;
  long lVar5;
  basic_format_specs<char> specs;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_40;
  format_specs local_20;
  
  pcVar3 = (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .parse_context_.format_str_.data_;
  lVar5 = (long)p - (long)pcVar3;
  if (lVar5 < 0) {
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/core.h"
                  ,0xde,
                  "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                 );
  }
  (this->context).
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  .parse_context_.format_str_.data_ = pcVar3 + lVar5;
  psVar1 = &(this->context).
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            .parse_context_.format_str_.size_;
  *psVar1 = *psVar1 - lVar5;
  local_40.ctx_ = &this->context;
  tVar2 = (this->arg).type_;
  if (tVar2 != custom_type) {
    if (tVar2 != named_arg_type) {
      local_40.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      specs_ = &local_20;
      local_20.super_align_spec.width_ = 0;
      local_20.super_align_spec.fill_ = L' ';
      local_20.super_align_spec.align_ = ALIGN_DEFAULT;
      local_20.flags_ = 0;
      local_20.precision_ = -1;
      local_20.type_ = '\0';
      local_40.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.out_.container =
           (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .out_.container;
      local_40.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.locale_._M_t.
      super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
      ._M_t.
      super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
      .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl =
           (__uniq_ptr_data<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>,_true,_true>
            )(__uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
              )0x0;
      tVar4 = visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_40,&this->arg);
      (this->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      .out_.container = tVar4.container;
      if ((_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)
          local_40.
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          .writer_.locale_._M_t.
          super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
          ._M_t.
          super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
          .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl !=
          (_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_40.
            super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            .writer_.locale_._M_t.
            super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
            ._M_t.
            super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
            .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl)[1])();
      }
      return;
    }
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/format.h"
                  ,0x496,
                  "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, const basic_format_arg<Context> &) [Visitor = fmt::internal::custom_formatter<char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                 );
  }
  (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,local_40.ctx_);
  return;
}

Assistant:

inline T const_check(T value) { return value; }